

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Own<const_kj::WritableFileMapping,_std::nullptr_t> __thiscall
kj::anon_unknown_9::DiskFile::mmapWritable(DiskFile *this,uint64_t offset,uint64_t size)

{
  void *pvVar1;
  undefined8 *puVar2;
  int *piVar3;
  uint64_t in_RCX;
  WritableFileMapping *extraout_RDX;
  WritableFileMapping *extraout_RDX_00;
  WritableFileMapping *pWVar4;
  uchar *puVar5;
  MmapRange MVar6;
  Own<const_kj::WritableFileMapping,_std::nullptr_t> OVar7;
  Array<unsigned_char> array;
  Fault f;
  Own<kj::(anonymous_namespace)::DiskHandle::WritableFileMappingImpl,_std::nullptr_t> local_38;
  
  if (in_RCX == 0) {
    puVar2 = (undefined8 *)operator_new(0x20);
    *puVar2 = &PTR_get_00260670;
    puVar2[1] = 0;
    puVar2[2] = 0;
    puVar2[3] = 0;
    f.exception = (Exception *)0x0;
    array.ptr = (uchar *)&_::
                          HeapDisposer<kj::(anonymous_namespace)::DiskHandle::WritableFileMappingImpl>
                          ::instance;
    Array<unsigned_char>::~Array((Array<unsigned_char> *)&f);
    (this->super_File).super_ReadableFile.super_FsNode._vptr_FsNode =
         (_func_int **)
         &_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::WritableFileMappingImpl>::instance;
    *(undefined8 **)&this->super_DiskHandle = puVar2;
    array.size_ = 0;
    Own<kj::(anonymous_namespace)::DiskHandle::WritableFileMappingImpl,_std::nullptr_t>::~Own
              ((Own<kj::(anonymous_namespace)::DiskHandle::WritableFileMappingImpl,_std::nullptr_t>
                *)&array);
    pWVar4 = extraout_RDX_00;
  }
  else {
    MVar6 = getMmapRange(size,in_RCX);
    pvVar1 = mmap64((void *)0x0,MVar6.size,3,1,*(int *)(offset + 8),MVar6.offset);
    if (pvVar1 == (void *)0xffffffffffffffff) {
      piVar3 = __errno_location();
      _::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x1f9,*piVar3,"mmap","");
      _::Debug::Fault::fatal(&f);
    }
    puVar5 = (uchar *)((long)pvVar1 + (size - MVar6.offset));
    array.disposer = (ArrayDisposer *)&(anonymous_namespace)::mmapDisposer;
    array.ptr = puVar5;
    puVar2 = (undefined8 *)operator_new(0x20);
    array.ptr = (uchar *)0x0;
    array.size_ = 0;
    *puVar2 = &PTR_get_00260670;
    puVar2[1] = puVar5;
    puVar2[2] = in_RCX;
    puVar2[3] = &(anonymous_namespace)::mmapDisposer;
    f.exception = (Exception *)0x0;
    local_38.disposer =
         (Disposer *)
         &_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::WritableFileMappingImpl>::instance;
    Array<unsigned_char>::~Array((Array<unsigned_char> *)&f);
    (this->super_File).super_ReadableFile.super_FsNode._vptr_FsNode =
         (_func_int **)
         &_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::WritableFileMappingImpl>::instance;
    *(undefined8 **)&this->super_DiskHandle = puVar2;
    local_38.ptr = (WritableFileMappingImpl *)0x0;
    Own<kj::(anonymous_namespace)::DiskHandle::WritableFileMappingImpl,_std::nullptr_t>::~Own
              (&local_38);
    Array<unsigned_char>::~Array(&array);
    pWVar4 = extraout_RDX;
  }
  OVar7.ptr = pWVar4;
  OVar7.disposer = (Disposer *)this;
  return OVar7;
}

Assistant:

Own<const WritableFileMapping> mmapWritable(uint64_t offset, uint64_t size) const override {
    return DiskHandle::mmapWritable(offset, size);
  }